

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DataPiece *
google::protobuf::util::converter::DefaultValueObjectWriter::FindEnumDefault
          (DataPiece *__return_storage_ptr__,Field *field,TypeInfo *typeinfo,bool use_ints_for_enums
          )

{
  int32 iVar1;
  char *pcVar2;
  stringpiece_ssize_type sVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Type *pTVar7;
  LogMessage *pLVar8;
  string *str;
  StringPiece *this;
  LogMessage local_a0;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_48;
  LogFinisher local_31;
  long lVar6;
  
  str = (field->default_value_).ptr_;
  if (str->_M_string_length != 0) {
    this = &local_68;
LAB_00329488:
    StringPiece::StringPiece<std::allocator<char>>(this,str);
    pcVar2 = this->ptr_;
    sVar3 = this->length_;
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_STRING;
    (__return_storage_ptr__->field_2).i64_ = (int64)pcVar2;
    (__return_storage_ptr__->field_2).str_.size_ = sVar3;
    bVar4 = true;
    goto LAB_0032959a;
  }
  StringPiece::StringPiece<std::allocator<char>>(&local_58,(field->type_url_).ptr_);
  iVar5 = (*typeinfo->_vptr_TypeInfo[4])(typeinfo,local_58.ptr_,local_58.length_);
  lVar6 = CONCAT44(extraout_var,iVar5);
  if (lVar6 == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
               ,0x1a6);
    pLVar8 = protobuf::internal::LogMessage::operator<<
                       (&local_a0,"Could not find enum with type \'");
    pLVar8 = protobuf::internal::LogMessage::operator<<(pLVar8,(field->type_url_).ptr_);
    pLVar8 = protobuf::internal::LogMessage::operator<<(pLVar8,"\'");
    protobuf::internal::LogFinisher::operator=(&local_31,pLVar8);
    protobuf::internal::LogMessage::~LogMessage(&local_a0);
LAB_0032957f:
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_NULL;
    (__return_storage_ptr__->field_2).i32_ = 0;
  }
  else {
    if (*(int *)(lVar6 + 0x18) < 1) goto LAB_0032957f;
    pTVar7 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                       ((RepeatedPtrFieldBase *)(lVar6 + 0x10),0);
    if (!use_ints_for_enums) {
      str = (pTVar7->name_).ptr_;
      this = &local_48;
      goto LAB_00329488;
    }
    iVar1 = pTVar7->number_;
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_INT32;
    (__return_storage_ptr__->field_2).i32_ = iVar1;
  }
  bVar4 = false;
LAB_0032959a:
  __return_storage_ptr__->use_strict_base64_decoding_ = bVar4;
  return __return_storage_ptr__;
}

Assistant:

DataPiece DefaultValueObjectWriter::FindEnumDefault(
    const google::protobuf::Field& field, const TypeInfo* typeinfo,
    bool use_ints_for_enums) {
  if (!field.default_value().empty())
    return DataPiece(field.default_value(), true);

  const google::protobuf::Enum* enum_type =
      typeinfo->GetEnumByTypeUrl(field.type_url());
  if (!enum_type) {
    GOOGLE_LOG(WARNING) << "Could not find enum with type '" << field.type_url()
                 << "'";
    return DataPiece::NullData();
  }
  // We treat the first value as the default if none is specified.
  return enum_type->enumvalue_size() > 0
             ? (use_ints_for_enums
                    ? DataPiece(enum_type->enumvalue(0).number())
                    : DataPiece(enum_type->enumvalue(0).name(), true))
             : DataPiece::NullData();
}